

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O1

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf32s_be,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_u>
          (Utf8Dfa *this,EncodingEmitter_u *emitter,utf8_t *p)

{
  uint_t uVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    uVar4 = 0xc0;
    break;
  case 2:
  case 3:
    uVar4 = 0xe0;
    break;
  case 4:
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xe0;
    goto LAB_00149f83;
  default:
    goto switchD_00149f41_caseD_5;
  case 6:
  case 7:
    uVar4 = 0xf0;
    break;
  case 8:
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xf0;
LAB_00149f83:
    puVar3 = (uint *)emitter->m_p;
    *puVar3 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    emitter->m_p = (DstUnit *)(puVar3 + 1);
    puVar3[1] = ((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU) << 0x18
                | 0x80000000;
    puVar3 = puVar3 + 2;
    goto LAB_00149ff2;
  case 10:
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc;
    puVar3 = (uint *)emitter->m_p;
    *puVar3 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
              (uVar4 | 0xf0) << 0x18;
    emitter->m_p = (DstUnit *)(puVar3 + 1);
    puVar3[1] = ((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0xfc0U) << 0x12
                | 0x80000000;
    emitter->m_p = (DstUnit *)(puVar3 + 2);
    puVar3[2] = ((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU) << 0x18
                | 0x80000000;
    puVar3 = puVar3 + 3;
    goto LAB_00149ff2;
  }
  uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
  puVar3 = (uint *)emitter->m_p;
  *puVar3 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
            (uVar4 | uVar2) << 0x18;
  puVar3 = puVar3 + 1;
LAB_00149ff2:
  emitter->m_p = (DstUnit *)puVar3;
switchD_00149f41_caseD_5:
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}